

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.h
# Opt level: O0

color_rgba __thiscall
basisu::etc_block::get_block_color(etc_block *this,uint32_t subblock_index,bool scaled)

{
  bool bVar1;
  int in_ESI;
  etc_block *in_RDI;
  color_rgba *unaff_retaddr;
  color_rgba b;
  undefined1 in_stack_ffffffffffffffcd;
  uint16_t in_stack_ffffffffffffffce;
  undefined6 in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd6;
  uint32_t idx;
  undefined1 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe1;
  uint16_t in_stack_ffffffffffffffe2;
  undefined4 in_stack_ffffffffffffffe4;
  etc_block *peVar2;
  uint32_t alpha;
  undefined1 in_stack_fffffffffffffffb;
  anon_union_4_2_6eba8969_for_color_rgba_0 in_stack_fffffffffffffffc;
  
  peVar2 = in_RDI;
  color_rgba::color_rgba((color_rgba *)&stack0xfffffffffffffffc);
  alpha = (uint32_t)((ulong)peVar2 >> 0x20);
  bVar1 = get_diff_bit(in_RDI);
  idx = (uint32_t)((ulong)in_RDI >> 0x20);
  if (bVar1) {
    if (in_ESI == 0) {
      get_base5_color((etc_block *)
                      CONCAT44(in_stack_ffffffffffffffe4,
                               CONCAT22(in_stack_ffffffffffffffe2,
                                        CONCAT11(in_stack_ffffffffffffffe1,in_stack_ffffffffffffffe0
                                                ))));
      unpack_color5((color_rgba *)CONCAT26(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0),
                    in_stack_ffffffffffffffce,(bool)in_stack_ffffffffffffffcd);
    }
    else {
      get_base5_color((etc_block *)
                      CONCAT44(in_stack_ffffffffffffffe4,
                               CONCAT22(in_stack_ffffffffffffffe2,
                                        CONCAT11(in_stack_ffffffffffffffe1,in_stack_ffffffffffffffe0
                                                ))));
      get_delta3_color((etc_block *)
                       CONCAT44(in_stack_ffffffffffffffe4,
                                CONCAT22(in_stack_ffffffffffffffe2,
                                         CONCAT11(in_stack_ffffffffffffffe1,
                                                  in_stack_ffffffffffffffe0))));
      unpack_color5(unaff_retaddr,in_stack_fffffffffffffffc._2_2_,in_stack_fffffffffffffffc._0_2_,
                    (bool)in_stack_fffffffffffffffb,alpha);
    }
  }
  else {
    get_base4_color((etc_block *)
                    CONCAT44(in_stack_ffffffffffffffe4,
                             CONCAT22(in_stack_ffffffffffffffe2,
                                      CONCAT11(in_stack_ffffffffffffffe1,in_stack_ffffffffffffffe0))
                            ),idx);
    in_stack_fffffffffffffffc.field_1 =
         (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
         unpack_color4(in_stack_ffffffffffffffe2,(bool)in_stack_ffffffffffffffe1,idx);
  }
  return (anon_union_4_2_6eba8969_for_color_rgba_0)
         (anon_union_4_2_6eba8969_for_color_rgba_0)in_stack_fffffffffffffffc.field_1;
}

Assistant:

color_rgba get_block_color(uint32_t subblock_index, bool scaled) const
		{
			color_rgba b;

			if (get_diff_bit())
			{
				if (subblock_index)
					unpack_color5(b, get_base5_color(), get_delta3_color(), scaled);
				else
					unpack_color5(b, get_base5_color(), scaled);
			}
			else
			{
				b = unpack_color4(get_base4_color(subblock_index), scaled);
			}

			return b;
		}